

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

void req0_ctx_recv(void *arg,nni_aio *aio)

{
  long lVar1;
  nni_msg *msg_00;
  _Bool _Var2;
  size_t count;
  nng_err local_34;
  int rv;
  nni_msg *msg;
  req0_sock *s;
  req0_ctx *ctx;
  nni_aio *aio_local;
  void *arg_local;
  
  lVar1 = *arg;
  nni_mtx_lock((nni_mtx *)(lVar1 + 0x358));
  if ((*(long *)((long)arg + 0x50) == 0) &&
     ((*(long *)((long)arg + 0x60) != 0 || (*(long *)((long)arg + 0x70) != 0)))) {
    msg_00 = *(nni_msg **)((long)arg + 0x70);
    if (msg_00 == (nni_msg *)0x0) {
      _Var2 = nni_aio_start(aio,req0_ctx_cancel_recv,arg);
      if (_Var2) {
        *(nni_aio **)((long)arg + 0x50) = aio;
        nni_mtx_unlock((nni_mtx *)(lVar1 + 0x358));
      }
      else {
        nni_mtx_unlock((nni_mtx *)(lVar1 + 0x358));
      }
    }
    else {
      *(undefined8 *)((long)arg + 0x70) = 0;
      nni_aio_set_msg(aio,msg_00);
      if (arg == (void *)(lVar1 + 0x10)) {
        nni_pollable_clear((nni_pollable *)(lVar1 + 0x330));
      }
      nni_mtx_unlock((nni_mtx *)(lVar1 + 0x358));
      count = nni_msg_len(msg_00);
      nni_aio_finish(aio,NNG_OK,count);
    }
  }
  else {
    if ((*(byte *)((long)arg + 0x88) & 1) == 0) {
      local_34 = NNG_ESTATE;
    }
    else {
      *(undefined1 *)((long)arg + 0x88) = 0;
      local_34 = NNG_ECONNRESET;
    }
    nni_mtx_unlock((nni_mtx *)(lVar1 + 0x358));
    nni_aio_finish_error(aio,local_34);
  }
  return;
}

Assistant:

static void
req0_ctx_recv(void *arg, nni_aio *aio)
{
	req0_ctx  *ctx = arg;
	req0_sock *s   = ctx->sock;
	nni_msg   *msg;

	nni_mtx_lock(&s->mtx);
	if ((ctx->recv_aio != NULL) ||
	    ((ctx->req_msg == NULL) && (ctx->rep_msg == NULL))) {
		// We have already got a pending receive or have not
		// tried to send a request yet.
		// Either of these violate our basic state assumptions.
		int rv;
		if (ctx->conn_reset) {
			ctx->conn_reset = false;
			rv              = NNG_ECONNRESET;
		} else {
			rv = NNG_ESTATE;
		}
		nni_mtx_unlock(&s->mtx);
		nni_aio_finish_error(aio, rv);
		return;
	}

	if ((msg = ctx->rep_msg) == NULL) {
		if (!nni_aio_start(aio, req0_ctx_cancel_recv, ctx)) {
			nni_mtx_unlock(&s->mtx);
			return;
		}
		ctx->recv_aio = aio;
		nni_mtx_unlock(&s->mtx);
		return;
	}

	ctx->rep_msg = NULL;

	// We have got a message to pass up, yay!
	nni_aio_set_msg(aio, msg);
	if (ctx == &s->master) {
		nni_pollable_clear(&s->readable);
	}
	nni_mtx_unlock(&s->mtx);
	nni_aio_finish(aio, 0, nni_msg_len(msg));
}